

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O1

void sys_doflags(void)

{
  int iVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  void *__dest;
  void *pvVar7;
  char **argv;
  char cVar8;
  uint uVar9;
  char *__s;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  char *pcVar14;
  char strings [1000];
  void *local_428;
  char local_418 [1000];
  
  if (sys_flags == (t_symbol *)0x0) {
    sys_flags = &s_;
  }
  pcVar12 = sys_flags->s_name;
  sVar5 = strlen(pcVar12);
  if (1000 < (int)sVar5) {
    pd_error((void *)0x0,"flags: %s: too long",pcVar12);
    return;
  }
  sVar5 = strlen(pcVar12);
  if ((int)sVar5 < 1000) {
    __s = local_418;
    memset(__s,0,1000);
    memcpy(__s,pcVar12,(long)(int)sVar5);
    local_428 = (void *)0x0;
    uVar10 = 1;
    uVar9 = 0;
    do {
      uVar11 = uVar9;
      cVar8 = *__s;
      if (cVar8 == '\0') {
        argv = (char **)realloc(local_428,(long)(int)uVar11 * 8 + 8);
        if (argv == (char **)0x0) {
          uVar11 = 0x17;
          goto LAB_00176f82;
        }
        argv[(int)uVar11] = (char *)0x0;
        uVar9 = uVar11;
        goto LAB_00176f8e;
      }
      pcVar12 = __s;
      pcVar6 = __s;
      cVar2 = '\0';
      do {
        pcVar14 = pcVar6 + 1;
        iVar4 = 6;
        if ((cVar8 == '\t' || cVar8 == ' ') && cVar2 == '\0') {
LAB_00176df8:
          cVar3 = '\0';
        }
        else if (cVar8 == '\\') {
          cVar8 = pcVar6[1];
          pcVar14 = pcVar6 + 2;
          iVar1 = 5;
          if (cVar8 == '\0') {
            iVar4 = 2;
            uVar10 = 10;
            cVar3 = cVar2;
          }
          else {
LAB_00176e2d:
            iVar4 = iVar1;
            *pcVar12 = cVar8;
            pcVar12 = pcVar12 + 1;
            cVar3 = cVar2;
          }
        }
        else {
          iVar4 = 5;
          if (cVar2 == cVar8) goto LAB_00176df8;
          iVar1 = 0;
          if ((cVar2 != '\0') || ((cVar3 = cVar8, cVar8 != '\"' && (cVar8 != '\''))))
          goto LAB_00176e2d;
        }
        uVar9 = uVar11;
        if ((iVar4 != 0) && (iVar4 != 5)) {
          if (iVar4 != 6) goto LAB_00176e8a;
          break;
        }
        cVar8 = *pcVar14;
        pcVar6 = pcVar14;
        cVar2 = cVar3;
      } while (cVar8 != '\0');
      iVar4 = 2;
      if (cVar3 == '\0') {
        pcVar6 = pcVar12;
        if (pcVar14 != pcVar12) goto LAB_00176eb7;
        while ((pcVar6 = pcVar14, *pcVar6 == ' ' || (*pcVar6 == '\t'))) {
          pcVar14 = pcVar6 + 1;
LAB_00176eb7:
          *pcVar6 = '\0';
        }
        __dest = calloc(((long)pcVar12 - (long)__s) + 1,1);
        pcVar14 = pcVar6;
        if (__dest == (void *)0x0) {
          uVar10 = 0x16;
        }
        else {
          memcpy(__dest,__s,(long)pcVar12 - (long)__s);
          pvVar7 = realloc(local_428,(long)(int)uVar11 * 8 + 8);
          if (pvVar7 == (void *)0x0) {
            free(__dest);
            uVar10 = 0x17;
          }
          else {
            *(void **)((long)pvVar7 + (long)(int)uVar11 * 8) = __dest;
            iVar4 = 0;
            local_428 = pvVar7;
            uVar9 = uVar11 + 1;
          }
        }
      }
      else {
        uVar10 = 0xb;
      }
LAB_00176e8a:
      uVar11 = uVar10;
      __s = pcVar14;
      uVar10 = uVar11;
    } while (iVar4 == 0);
    if (iVar4 != 2) {
      argv = (char **)0x0;
      uVar9 = 0;
      goto LAB_00176f8e;
    }
  }
  else {
    uVar11 = 1;
    local_428 = (void *)0x0;
  }
LAB_00176f82:
  free(local_428);
  uVar11 = -uVar11;
  argv = (char **)0x0;
  uVar9 = 0;
LAB_00176f8e:
  if ((int)uVar11 < 0) {
    pd_error((void *)0x0,"error#%d while parsing flags",(ulong)uVar11);
  }
  else {
    iVar4 = sys_argparse(uVar9,argv);
    if (iVar4 != 0) {
      pd_error((void *)0x0,"error parsing startup arguments");
    }
    if (0 < (int)uVar9) {
      uVar13 = 0;
      do {
        free(argv[uVar13]);
        uVar13 = uVar13 + 1;
      } while (uVar9 != uVar13);
    }
    free(argv);
  }
  return;
}

Assistant:

void sys_doflags(void)
{
    int rcargc=0;
    const char**rcargv = NULL;
    int len;
    int rcode = 0;
    if (!sys_flags)
        sys_flags = &s_;
    len = (int)strlen(sys_flags->s_name);
    if (len > MAXPDSTRING)
    {
        pd_error(0, "flags: %s: too long", sys_flags->s_name);
        return;
    }
    rcode = string2args(sys_flags->s_name, &rcargc, &rcargv);
    if(rcode < 0) {
        pd_error(0, "error#%d while parsing flags", rcode);
        return;
    }

    if (sys_argparse(rcargc, rcargv))
        pd_error(0, "error parsing startup arguments");

    for(len=0; len<rcargc; len++)
        free((void*)rcargv[len]);
    free(rcargv);
}